

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O1

void __thiscall
cppcms::forwarder::remove_forwarding_rule(forwarder *this,shared_ptr<cppcms::mount_point> *p)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  pVar1;
  unique_lock<booster::shared_mutex> lock;
  unique_lock<booster::shared_mutex> local_28;
  
  local_28._M_device = &this->mutex_;
  local_28._M_owns = false;
  std::unique_lock<booster::shared_mutex>::lock(&local_28);
  local_28._M_owns = true;
  pVar1 = std::
          _Rb_tree<std::shared_ptr<cppcms::mount_point>,_std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::_Select1st<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
          ::equal_range((_Rb_tree<std::shared_ptr<cppcms::mount_point>,_std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::_Select1st<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                         *)this,p);
  std::
  _Rb_tree<std::shared_ptr<cppcms::mount_point>,_std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::_Select1st<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::_M_erase_aux((_Rb_tree<std::shared_ptr<cppcms::mount_point>,_std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::_Select1st<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                  *)this,(_Base_ptr)pVar1.first._M_node,(_Base_ptr)pVar1.second._M_node);
  std::unique_lock<booster::shared_mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void forwarder::remove_forwarding_rule(booster::shared_ptr<mount_point> p)
	{
		booster::unique_lock<booster::shared_mutex> lock(mutex_);
		rules_.erase(p);
	}